

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

size_t ZSTD_compress_usingDict
                 (ZSTD_CCtx *cctx,void *dst,size_t dstCapacity,void *src,size_t srcSize,void *dict,
                 size_t dictSize,int compressionLevel)

{
  ZSTD_CCtx_params cctxParams_00;
  ZSTD_CCtx_params params_00;
  ZSTD_parameters params_01;
  size_t sVar1;
  undefined8 in_stack_ffffffffffffff00;
  size_t local_f8;
  undefined8 uStack_e0;
  ZSTD_CCtx_params cctxParams;
  ZSTD_parameters params;
  void *dict_local;
  size_t srcSize_local;
  void *src_local;
  size_t dstCapacity_local;
  void *dst_local;
  ZSTD_CCtx *cctx_local;
  
  if (dict == (void *)0x0) {
    local_f8 = 0;
  }
  else {
    local_f8 = dictSize;
  }
  ZSTD_getParams((ZSTD_parameters *)&cctxParams.customMem.opaque,compressionLevel,
                 srcSize + (long)(int)(uint)((srcSize != 0 ^ 0xffU) & 1),local_f8);
  cctxParams_00.customMem.opaque = cctxParams.customMem.opaque;
  cctxParams_00._0_120_ = *(undefined1 (*) [120])&(cctx->requestedParams).cParams.chainLog;
  params_01.cParams._8_8_ = params.cParams._8_8_;
  params_01.cParams._0_8_ = params.cParams._0_8_;
  params_01.cParams._16_8_ = params.cParams._16_8_;
  params_01._24_8_ = params._24_8_;
  params_01.fParams.checksumFlag = (int)in_stack_ffffffffffffff00;
  params_01.fParams.noDictIDFlag = (int)((ulong)in_stack_ffffffffffffff00 >> 0x20);
  ZSTD_assignParamsToCCtxParams(cctxParams_00,params_01);
  params_00.cParams.chainLog = cctxParams.format;
  params_00.cParams.hashLog = cctxParams.cParams.windowLog;
  params_00._0_8_ = uStack_e0;
  params_00.cParams.searchLog = cctxParams.cParams.chainLog;
  params_00.cParams.minMatch = cctxParams.cParams.hashLog;
  params_00.cParams.targetLength = cctxParams.cParams.searchLog;
  params_00.cParams.strategy = cctxParams.cParams.minMatch;
  params_00.fParams.contentSizeFlag = cctxParams.cParams.targetLength;
  params_00.fParams.checksumFlag = cctxParams.cParams.strategy;
  params_00.fParams.noDictIDFlag = cctxParams.fParams.contentSizeFlag;
  params_00.compressionLevel = cctxParams.fParams.checksumFlag;
  params_00.forceWindow = cctxParams.fParams.noDictIDFlag;
  params_00.attachDictPref = cctxParams.compressionLevel;
  params_00.nbWorkers = cctxParams.forceWindow;
  params_00._60_4_ = cctxParams.attachDictPref;
  params_00.jobSize = cctxParams._56_8_;
  params_00.overlapLog = (undefined4)cctxParams.jobSize;
  params_00.rsyncable = cctxParams.jobSize._4_4_;
  params_00.ldmParams.enableLdm = cctxParams.overlapLog;
  params_00.ldmParams.hashLog = cctxParams.rsyncable;
  params_00.ldmParams.bucketSizeLog = cctxParams.ldmParams.enableLdm;
  params_00.ldmParams.minMatchLength = cctxParams.ldmParams.hashLog;
  params_00.ldmParams.hashRateLog = cctxParams.ldmParams.bucketSizeLog;
  params_00.ldmParams.windowLog = cctxParams.ldmParams.minMatchLength;
  params_00.customMem.customAlloc = (ZSTD_allocFunction)cctxParams.ldmParams._16_8_;
  params_00.customMem.customFree = (ZSTD_freeFunction)cctxParams.customMem.customAlloc;
  params_00.customMem.opaque = cctxParams.customMem.customFree;
  sVar1 = ZSTD_compress_advanced_internal(cctx,dst,dstCapacity,src,srcSize,dict,dictSize,params_00);
  return sVar1;
}

Assistant:

size_t ZSTD_compress_usingDict(ZSTD_CCtx* cctx,
                               void* dst, size_t dstCapacity,
                         const void* src, size_t srcSize,
                         const void* dict, size_t dictSize,
                               int compressionLevel)
{
    ZSTD_parameters const params = ZSTD_getParams(compressionLevel, srcSize + (!srcSize), dict ? dictSize : 0);
    ZSTD_CCtx_params cctxParams = ZSTD_assignParamsToCCtxParams(cctx->requestedParams, params);
    assert(params.fParams.contentSizeFlag == 1);
    return ZSTD_compress_advanced_internal(cctx, dst, dstCapacity, src, srcSize, dict, dictSize, cctxParams);
}